

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestProgramStart(StreamingListener *this,UnitTest *param_1)

{
  string local_40;
  allocator local_19;
  
  std::__cxx11::string::string((string *)&local_40,"event=TestProgramStart",&local_19);
  SendLn(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void OnTestProgramStart(const UnitTest& /* unit_test */) override {
    SendLn("event=TestProgramStart");
  }